

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_decoder.cc
# Opt level: O1

int main(int argc,char **argv)

{
  undefined4 uVar1;
  size_type sVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int64_t iVar7;
  _Head_base<0UL,_draco::Mesh_*,_false> pc;
  char *pcVar8;
  int iVar9;
  _Head_base<0UL,_draco::Mesh_*,_false> mesh;
  string extension;
  Options options;
  vector<char,_std::allocator<char>_> data;
  StatusOr<draco::EncodedGeometryType> type_statusor;
  CycleTimer timer;
  Decoder decoder;
  DecoderBuffer buffer;
  StlEncoder stl_encoder;
  undefined1 local_258 [40];
  _Head_base<0UL,_draco::Mesh_*,_false> local_230;
  string local_228;
  string local_208;
  vector<char,_std::allocator<char>_> local_1e8;
  StatusOr<draco::EncodedGeometryType> local_1d0;
  DracoTimer local_1a0;
  undefined1 local_180 [16];
  undefined1 local_170 [24];
  PointAttribute *local_158;
  PointCloud local_148;
  DecoderBuffer local_80;
  StlEncoder local_48;
  
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  local_208._M_string_length = 0;
  local_208.field_2._M_local_buf[0] = '\0';
  if (1 < argc) {
    iVar9 = 1;
    do {
      pcVar8 = argv[iVar9];
      iVar6 = strcmp("-h",pcVar8);
      if ((iVar6 == 0) || (iVar6 = strcmp("-?",pcVar8), iVar6 == 0)) {
        anon_unknown.dwarf_9286::Usage();
        iVar9 = 0;
        goto LAB_0010ab21;
      }
      iVar6 = strcmp("-i",pcVar8);
      sVar2 = local_228._M_string_length;
      if (iVar9 < argc + -1 && iVar6 == 0) {
        pcVar8 = argv[(long)iVar9 + 1];
        strlen(pcVar8);
        std::__cxx11::string::_M_replace((ulong)&local_228,0,(char *)sVar2,(ulong)pcVar8);
LAB_0010a9be:
        iVar9 = iVar9 + 1;
      }
      else {
        iVar6 = strcmp("-o",pcVar8);
        sVar2 = local_208._M_string_length;
        if (iVar6 == 0 && iVar9 < argc + -1) {
          pcVar8 = argv[(long)iVar9 + 1];
          strlen(pcVar8);
          std::__cxx11::string::_M_replace((ulong)&local_208,0,(char *)sVar2,(ulong)pcVar8);
          goto LAB_0010a9be;
        }
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < argc);
  }
  if ((argc < 3) || ((char *)local_228._M_string_length == (char *)0x0)) {
    anon_unknown.dwarf_9286::Usage();
    iVar9 = -1;
    goto LAB_0010ab21;
  }
  local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (char *)0x0;
  local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar4 = draco::ReadFileToBuffer(&local_228,&local_1e8);
  if (bVar4) {
    if (local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      pcVar8 = "Empty input file.";
      goto LAB_0010aafa;
    }
    draco::DecoderBuffer::DecoderBuffer(&local_80);
    draco::DecoderBuffer::Init
              (&local_80,
               local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
    draco::Decoder::GetEncodedGeometryType(&local_1d0,&local_80);
    if (local_1d0.status_.code_ == OK) {
      if (local_1d0.value_ == POINT_CLOUD) {
        draco::DracoTimer::Start(&local_1a0);
        local_170._8_8_ = local_180 + 8;
        local_180._8_4_ = _S_red;
        local_170._0_8_ = (_Base_ptr)0x0;
        local_158 = (PointAttribute *)0x0;
        local_148.attributes_.
        super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_148;
        local_148._vptr_PointCloud._0_4_ = _S_red;
        local_148.metadata_._M_t.
        super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
        ._M_t.
        super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
        .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl =
             (__uniq_ptr_data<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>,_true,_true>
              )(__uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
                )0x0;
        local_148.attributes_.
        super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_148.named_attribute_index_[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_148.named_attribute_index_[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_170._16_8_ = local_170._8_8_;
        local_148.attributes_.
        super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_148.attributes_.
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        draco::Decoder::DecodePointCloudFromBuffer
                  ((StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
                    *)local_258,(Decoder *)local_180,&local_80);
        pc._M_head_impl = local_230._M_head_impl;
        uVar1 = local_258._0_4_;
        if (local_258._0_4_ == OK) {
          local_230._M_head_impl = (Mesh *)0x0;
          iVar9 = 0;
          draco::DracoTimer::Stop(&local_1a0);
        }
        else {
          pc._M_head_impl = (Mesh *)0x0;
          printf("Failed to decode the input file %s\n",local_258._8_8_);
          iVar9 = -1;
        }
        draco::
        StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
        ~StatusOr((StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
                   *)local_258);
        draco::Decoder::~Decoder((Decoder *)local_180);
        if (uVar1 == OK) {
          mesh._M_head_impl = (Mesh *)0x0;
          goto LAB_0010ad2e;
        }
      }
      else {
        if (local_1d0.value_ == TRIANGULAR_MESH) {
          draco::DracoTimer::Start(&local_1a0);
          local_170._8_8_ = local_180 + 8;
          local_180._8_4_ = _S_red;
          local_170._0_8_ = (_Base_ptr)0x0;
          local_158 = (PointAttribute *)0x0;
          local_148.attributes_.
          super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_148;
          local_148._vptr_PointCloud._0_4_ = _S_red;
          local_148.metadata_._M_t.
          super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
          ._M_t.
          super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
          .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl =
               (__uniq_ptr_data<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>,_true,_true>
                )(__uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
                  )0x0;
          local_148.attributes_.
          super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_148.named_attribute_index_[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_148.named_attribute_index_[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_170._16_8_ = local_170._8_8_;
          local_148.attributes_.
          super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_148.attributes_.
               super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          draco::Decoder::DecodeMeshFromBuffer
                    ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
                     local_258,(Decoder *)local_180,&local_80);
          pc._M_head_impl = local_230._M_head_impl;
          uVar1 = local_258._0_4_;
          if (local_258._0_4_ == OK) {
            local_230._M_head_impl = (Mesh *)0x0;
            iVar9 = 0;
            draco::DracoTimer::Stop(&local_1a0);
          }
          else {
            pc._M_head_impl = (Mesh *)0x0;
            printf("Failed to decode the input file %s\n",local_258._8_8_);
            iVar9 = -1;
          }
          draco::StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::
          ~StatusOr((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
                    local_258);
          draco::Decoder::~Decoder((Decoder *)local_180);
          mesh._M_head_impl = pc._M_head_impl;
          if (uVar1 != OK) goto LAB_0010aa97;
        }
        else {
          pc._M_head_impl = (Mesh *)0x0;
          iVar9 = 0;
          mesh._M_head_impl = (Mesh *)0x0;
        }
LAB_0010ad2e:
        if (pc._M_head_impl == (Mesh *)0x0) {
          puts("Failed to decode the input file.");
          goto LAB_0010aa92;
        }
        if ((char *)local_208._M_string_length == (char *)0x0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_180,&local_228,".ply");
          std::__cxx11::string::operator=((string *)&local_208,(string *)local_180);
          if ((undefined1 *)local_180._0_8_ != local_170) {
            operator_delete((void *)local_180._0_8_,(ulong)(local_170._0_8_ + 1));
          }
        }
        if (local_208._M_string_length < (char *)0x4) {
          local_180._0_8_ = local_170;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_180,local_208._M_dataplus._M_p,
                     (char *)(local_208._M_string_length + (long)local_208._M_dataplus._M_p));
        }
        else {
          std::__cxx11::string::substr((ulong)local_180,(ulong)&local_208);
        }
        draco::parser::ToLower((string *)local_258,(string *)local_180);
        if ((undefined1 *)local_180._0_8_ != local_170) {
          operator_delete((void *)local_180._0_8_,(ulong)(local_170._0_8_ + 1));
        }
        iVar6 = std::__cxx11::string::compare(local_258);
        if (iVar6 == 0) {
          draco::ObjEncoder::ObjEncoder((ObjEncoder *)local_180);
          if (mesh._M_head_impl == (Mesh *)0x0) {
            bVar5 = draco::ObjEncoder::EncodeToFile
                              ((ObjEncoder *)local_180,&(pc._M_head_impl)->super_PointCloud,
                               &local_208);
            bVar4 = true;
            if (!bVar5) {
              pcVar8 = "Failed to store the decoded point cloud as OBJ.";
              goto LAB_0010af90;
            }
          }
          else {
            bVar5 = draco::ObjEncoder::EncodeToFile
                              ((ObjEncoder *)local_180,mesh._M_head_impl,&local_208);
            bVar4 = true;
            if (!bVar5) {
              pcVar8 = "Failed to store the decoded mesh as OBJ.";
LAB_0010af90:
              puts(pcVar8);
              iVar9 = -1;
              bVar4 = false;
            }
          }
          draco::ObjEncoder::~ObjEncoder((ObjEncoder *)local_180);
LAB_0010afaa:
          if (bVar4) {
LAB_0010afe3:
            _Var3._M_p = local_208._M_dataplus._M_p;
            iVar7 = draco::DracoTimer::GetInMs(&local_1a0);
            iVar9 = 0;
            printf("Decoded geometry saved to %s (%ld ms to decode)\n",_Var3._M_p,iVar7);
          }
        }
        else {
          iVar6 = std::__cxx11::string::compare(local_258);
          if (iVar6 == 0) {
            draco::PlyEncoder::PlyEncoder((PlyEncoder *)local_180);
            if (mesh._M_head_impl == (Mesh *)0x0) {
              bVar5 = draco::PlyEncoder::EncodeToFile
                                ((PlyEncoder *)local_180,&(pc._M_head_impl)->super_PointCloud,
                                 &local_208);
              bVar4 = true;
              if (!bVar5) {
                pcVar8 = "Failed to store the decoded point cloud as PLY.";
                goto LAB_0010afd3;
              }
            }
            else {
              bVar5 = draco::PlyEncoder::EncodeToFile
                                ((PlyEncoder *)local_180,mesh._M_head_impl,&local_208);
              bVar4 = true;
              if (!bVar5) {
                pcVar8 = "Failed to store the decoded mesh as PLY.";
LAB_0010afd3:
                puts(pcVar8);
                iVar9 = -1;
                bVar4 = false;
              }
            }
            if (bVar4) goto LAB_0010afe3;
          }
          else {
            iVar6 = std::__cxx11::string::compare(local_258);
            if (iVar6 == 0) {
              draco::StlEncoder::StlEncoder(&local_48);
              if (mesh._M_head_impl == (Mesh *)0x0) {
                puts("Can\'t store a point cloud as STL.");
                iVar9 = -1;
                bVar4 = false;
              }
              else {
                draco::StlEncoder::EncodeToFile
                          ((Status *)local_180,&local_48,mesh._M_head_impl,&local_208);
                bVar4 = local_180._0_4_ == OK;
                if (!bVar4) {
                  puts("Failed to store the decoded mesh as STL.");
                  iVar9 = -1;
                }
                if ((undefined1 *)CONCAT44(local_180._12_4_,local_180._8_4_) != local_170 + 8) {
                  operator_delete((undefined1 *)CONCAT44(local_180._12_4_,local_180._8_4_),
                                  (ulong)(local_170._8_8_ + 1));
                }
              }
              goto LAB_0010afaa;
            }
            puts("Invalid output file extension. Use .obj .ply or .stl.");
            iVar9 = -1;
          }
        }
        if ((undefined1 *)CONCAT44(local_258._4_4_,local_258._0_4_) != local_258 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_258._4_4_,local_258._0_4_),
                          local_258._16_8_ + 1);
        }
      }
    }
    else {
      pc._M_head_impl = (Mesh *)0x0;
      printf("Failed to decode the input file %s\n",local_1d0.status_.error_msg_._M_dataplus._M_p);
LAB_0010aa92:
      iVar9 = -1;
    }
LAB_0010aa97:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.status_.error_msg_._M_dataplus._M_p != &local_1d0.status_.error_msg_.field_2) {
      operator_delete(local_1d0.status_.error_msg_._M_dataplus._M_p,
                      local_1d0.status_.error_msg_.field_2._M_allocated_capacity + 1);
    }
    if (pc._M_head_impl != (Mesh *)0x0) {
      (*((pc._M_head_impl)->super_PointCloud)._vptr_PointCloud[1])(pc._M_head_impl);
    }
    draco::DecoderBuffer::BitDecoder::~BitDecoder(&local_80.bit_decoder_);
  }
  else {
    pcVar8 = "Failed opening the input file.";
LAB_0010aafa:
    puts(pcVar8);
    iVar9 = -1;
  }
  if (local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_0010ab21:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                             local_208.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                             local_228.field_2._M_local_buf[0]) + 1);
  }
  return iVar9;
}

Assistant:

int main(int argc, char **argv) {
  Options options;
  const int argc_check = argc - 1;

  for (int i = 1; i < argc; ++i) {
    if (!strcmp("-h", argv[i]) || !strcmp("-?", argv[i])) {
      Usage();
      return 0;
    } else if (!strcmp("-i", argv[i]) && i < argc_check) {
      options.input = argv[++i];
    } else if (!strcmp("-o", argv[i]) && i < argc_check) {
      options.output = argv[++i];
    }
  }
  if (argc < 3 || options.input.empty()) {
    Usage();
    return -1;
  }

  std::vector<char> data;
  if (!draco::ReadFileToBuffer(options.input, &data)) {
    printf("Failed opening the input file.\n");
    return -1;
  }

  if (data.empty()) {
    printf("Empty input file.\n");
    return -1;
  }

  // Create a draco decoding buffer. Note that no data is copied in this step.
  draco::DecoderBuffer buffer;
  buffer.Init(data.data(), data.size());

  draco::CycleTimer timer;
  // Decode the input data into a geometry.
  std::unique_ptr<draco::PointCloud> pc;
  draco::Mesh *mesh = nullptr;
  auto type_statusor = draco::Decoder::GetEncodedGeometryType(&buffer);
  if (!type_statusor.ok()) {
    return ReturnError(type_statusor.status());
  }
  const draco::EncodedGeometryType geom_type = type_statusor.value();
  if (geom_type == draco::TRIANGULAR_MESH) {
    timer.Start();
    draco::Decoder decoder;
    auto statusor = decoder.DecodeMeshFromBuffer(&buffer);
    if (!statusor.ok()) {
      return ReturnError(statusor.status());
    }
    std::unique_ptr<draco::Mesh> in_mesh = std::move(statusor).value();
    timer.Stop();
    if (in_mesh) {
      mesh = in_mesh.get();
      pc = std::move(in_mesh);
    }
  } else if (geom_type == draco::POINT_CLOUD) {
    // Failed to decode it as mesh, so let's try to decode it as a point cloud.
    timer.Start();
    draco::Decoder decoder;
    auto statusor = decoder.DecodePointCloudFromBuffer(&buffer);
    if (!statusor.ok()) {
      return ReturnError(statusor.status());
    }
    pc = std::move(statusor).value();
    timer.Stop();
  }

  if (pc == nullptr) {
    printf("Failed to decode the input file.\n");
    return -1;
  }

  if (options.output.empty()) {
    // Save the output model into a ply file.
    options.output = options.input + ".ply";
  }

  // Save the decoded geometry into a file.
  const std::string extension = draco::parser::ToLower(
      options.output.size() >= 4
          ? options.output.substr(options.output.size() - 4)
          : options.output);

  if (extension == ".obj") {
    draco::ObjEncoder obj_encoder;
    if (mesh) {
      if (!obj_encoder.EncodeToFile(*mesh, options.output)) {
        printf("Failed to store the decoded mesh as OBJ.\n");
        return -1;
      }
    } else {
      if (!obj_encoder.EncodeToFile(*pc, options.output)) {
        printf("Failed to store the decoded point cloud as OBJ.\n");
        return -1;
      }
    }
  } else if (extension == ".ply") {
    draco::PlyEncoder ply_encoder;
    if (mesh) {
      if (!ply_encoder.EncodeToFile(*mesh, options.output)) {
        printf("Failed to store the decoded mesh as PLY.\n");
        return -1;
      }
    } else {
      if (!ply_encoder.EncodeToFile(*pc, options.output)) {
        printf("Failed to store the decoded point cloud as PLY.\n");
        return -1;
      }
    }
  } else if (extension == ".stl") {
    draco::StlEncoder stl_encoder;
    if (mesh) {
      draco::Status s = stl_encoder.EncodeToFile(*mesh, options.output);
      if (s.code() != draco::Status::OK) {
        printf("Failed to store the decoded mesh as STL.\n");
        return -1;
      }
    } else {
      printf("Can't store a point cloud as STL.\n");
      return -1;
    }
  } else {
    printf("Invalid output file extension. Use .obj .ply or .stl.\n");
    return -1;
  }
  printf("Decoded geometry saved to %s (%" PRId64 " ms to decode)\n",
         options.output.c_str(), timer.GetInMs());
  return 0;
}